

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_convolve_2d_facade
               (uint8_t *src8,int src_stride,uint8_t *dst8,int dst_stride,int w,int h,
               InterpFilterParams **interp_filters,int subpel_x_qn,int x_step_q4,int subpel_y_qn,
               int y_step_q4,int scaled,ConvolveParams *conv_params,int bd)

{
  InterpFilterParams *pIVar1;
  ConvolveParams *conv_params_00;
  uint16_t *puVar2;
  int in_ECX;
  long in_RDX;
  int unaff_EBX;
  int in_ESI;
  InterpFilterParams *in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_R12D;
  ConvolveParams *unaff_R13;
  int unaff_R14D;
  undefined8 *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  ConvolveParams *in_stack_00000038;
  uint16_t *dst;
  InterpFilterParams *filter_params_y;
  InterpFilterParams *filter_params_x;
  uint16_t *src;
  int in_stack_00008a84;
  int in_stack_00008a88;
  int in_stack_00008a8c;
  uint16_t *in_stack_00008a90;
  int in_stack_00008a9c;
  uint16_t *in_stack_00008aa0;
  InterpFilterParams *in_stack_00008ab0;
  InterpFilterParams *in_stack_00008ab8;
  int in_stack_00008ac0;
  int in_stack_00008ac8;
  ConvolveParams *in_stack_00008ad0;
  int in_stack_00008ad8;
  undefined8 in_stack_ffffffffffffff50;
  int iVar3;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  int iVar4;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffffc0;
  
  pIVar1 = (InterpFilterParams *)*in_stack_00000008;
  conv_params_00 = (ConvolveParams *)in_stack_00000008[1];
  puVar2 = (uint16_t *)(in_RDX << 1);
  iVar4 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if ((pIVar1->taps == 2) || (*(short *)&conv_params_00->dst == 2)) {
    if ((in_stack_00000010 != 0) && (in_stack_00000020 != 0)) {
      av1_highbd_convolve_2d_sr_intrabc_c
                (in_stack_00008aa0,in_stack_00008a9c,in_stack_00008a90,in_stack_00008a8c,
                 in_stack_00008a88,in_stack_00008a84,in_stack_00008ab0,in_stack_00008ab8,
                 in_stack_00008ac0,in_stack_00008ac8,in_stack_00008ad0,in_stack_00008ad8);
      return;
    }
    iVar3 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    if (in_stack_00000010 != 0) {
      av1_highbd_convolve_x_sr_intrabc_c
                ((uint16_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar4,
                 (uint16_t *)CONCAT44(in_stack_ffffffffffffff64,(int)dst),
                 (int)((ulong)in_stack_00000038 >> 0x20),(int)in_stack_00000038,iVar3,
                 (InterpFilterParams *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                 ,(int)puVar2,conv_params_00,(int)pIVar1);
      return;
    }
    if (in_stack_00000020 != 0) {
      av1_highbd_convolve_y_sr_intrabc_c
                ((uint16_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar4,
                 (uint16_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)dst,iVar3,
                 (InterpFilterParams *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                 ,(int)puVar2,(int)conv_params_00);
      return;
    }
  }
  if (in_stack_00000030 == 0) {
    iVar3 = (int)((ulong)puVar2 >> 0x20);
    iVar4 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (in_stack_00000038->is_compound == 0) {
      highbd_convolve_2d_facade_single
                ((uint16_t *)conv_params_00,iVar3,
                 (uint16_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar4,
                 (int)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 (InterpFilterParams *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0),in_RDI,unaff_EBX,
                 unaff_R12D,unaff_R13,unaff_R14D);
    }
    else {
      highbd_convolve_2d_facade_compound
                ((uint16_t *)conv_params_00,iVar3,
                 (uint16_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),iVar4,
                 (int)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 (InterpFilterParams *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0),in_RDI,unaff_EBX,
                 unaff_R12D,unaff_R13,unaff_R14D);
    }
  }
  else {
    (*av1_highbd_convolve_2d_scale)
              ((uint16_t *)((long)in_RDI << 1),in_ESI,puVar2,in_ECX,in_R8D,in_R9D,pIVar1,
               (InterpFilterParams *)conv_params_00,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_00000028,in_stack_00000038,(int)dst);
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_facade(const uint8_t *src8, int src_stride,
                                   uint8_t *dst8, int dst_stride, int w, int h,
                                   const InterpFilterParams *interp_filters[2],
                                   const int subpel_x_qn, int x_step_q4,
                                   const int subpel_y_qn, int y_step_q4,
                                   int scaled, ConvolveParams *conv_params,
                                   int bd) {
  (void)x_step_q4;
  (void)y_step_q4;
  (void)dst_stride;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);

  const InterpFilterParams *filter_params_x = interp_filters[0];
  const InterpFilterParams *filter_params_y = interp_filters[1];

  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  // 2-tap filter indicates that it is for IntraBC.
  if (filter_params_x->taps == 2 || filter_params_y->taps == 2) {
    assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
    assert(!scaled);
    if (subpel_x_qn && subpel_y_qn) {
      av1_highbd_convolve_2d_sr_intrabc_c(
          src, src_stride, dst, dst_stride, w, h, filter_params_x,
          filter_params_y, subpel_x_qn, subpel_y_qn, conv_params, bd);
      return;
    } else if (subpel_x_qn) {
      av1_highbd_convolve_x_sr_intrabc_c(src, src_stride, dst, dst_stride, w, h,
                                         filter_params_x, subpel_x_qn,
                                         conv_params, bd);
      return;
    } else if (subpel_y_qn) {
      av1_highbd_convolve_y_sr_intrabc_c(src, src_stride, dst, dst_stride, w, h,
                                         filter_params_y, subpel_y_qn, bd);
      return;
    }
  }

  if (scaled) {
    if (conv_params->is_compound) {
      assert(conv_params->dst != NULL);
    }
    av1_highbd_convolve_2d_scale(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_x, filter_params_y, subpel_x_qn,
                                 x_step_q4, subpel_y_qn, y_step_q4, conv_params,
                                 bd);
  } else if (conv_params->is_compound) {
    highbd_convolve_2d_facade_compound(
        src, src_stride, dst, dst_stride, w, h, filter_params_x,
        filter_params_y, subpel_x_qn, subpel_y_qn, conv_params, bd);
  } else {
    highbd_convolve_2d_facade_single(src, src_stride, dst, dst_stride, w, h,
                                     filter_params_x, filter_params_y,
                                     subpel_x_qn, subpel_y_qn, conv_params, bd);
  }
}